

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::AppendToTestWarningsOutputFile(string *str)

{
  int iVar1;
  char *__filename;
  FILE *__s;
  size_t sVar2;
  GTestLog GStack_18;
  GTestLog local_14;
  
  __filename = getenv("TEST_WARNINGS_OUTPUT_FILE");
  if (__filename != (char *)0x0) {
    __s = fopen(__filename,"a");
    if (__s != (FILE *)0x0) {
      sVar2 = fwrite((str->_M_dataplus)._M_p,1,str->_M_string_length,__s);
      if (sVar2 != str->_M_string_length) {
        GTestLog::GTestLog(&local_14,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/gtest-src/googletest/src/gtest.cc"
                           ,0x1707);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Condition fwrite(str.data(), 1, str.size(), file) == str.size() failed. ",0x48);
        GTestLog::~GTestLog(&local_14);
      }
      iVar1 = fclose(__s);
      if (iVar1 != 0) {
        GTestLog::GTestLog(&GStack_18,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/gtest-src/googletest/src/gtest.cc"
                           ,0x1708);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition posix::FClose(file) == 0 failed. ",0x2b);
        GTestLog::~GTestLog(&GStack_18);
      }
    }
  }
  return;
}

Assistant:

static void AppendToTestWarningsOutputFile(const std::string& str) {
  const char* const filename = posix::GetEnv(kTestWarningsOutputFile);
  if (filename == nullptr) {
    return;
  }
  auto* const file = posix::FOpen(filename, "a");
  if (file == nullptr) {
    return;
  }
  GTEST_CHECK_(fwrite(str.data(), 1, str.size(), file) == str.size());
  GTEST_CHECK_(posix::FClose(file) == 0);
}